

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void Cmd_menu_quit(FCommandLine *argv,APlayerPawn *who,int key)

{
  DMenu *menu;
  DMenu *newmenu;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  M_StartControlPanel(true);
  menu = (DMenu *)DObject::operator_new((DObject *)0x50,(size_t)who);
  DQuitMenu::DQuitMenu((DQuitMenu *)menu,false);
  TObjPtr<DMenu>::operator=(&menu->mParentMenu,DMenu::CurrentMenu);
  M_ActivateMenu(menu);
  return;
}

Assistant:

CCMD (menu_quit)
{	// F10
	M_StartControlPanel (true);
	DMenu *newmenu = new DQuitMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}